

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

int __thiscall
MlmWrap::route_mailbox_msgs
          (MlmWrap *this,char *address,char *sender,char *subject,char *tracker,zmsg_t *msg)

{
  char *sender_00;
  char *in_RCX;
  TrodesMsg *in_RDX;
  TrodesMsg *in_RDI;
  zmsg_t *in_R9;
  TrodesMsg m;
  string format;
  char *f;
  zmsg_t *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  MlmWrap *this_00;
  string local_b8 [95];
  undefined1 local_59 [33];
  char *local_38;
  char *local_20;
  TrodesMsg *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  sender_00 = zmsg_popstr(in_R9);
  this_00 = (MlmWrap *)local_59;
  local_38 = sender_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_59 + 1),sender_00,(allocator *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)local_59);
  free(local_38);
  local_38 = (char *)0x0;
  std::__cxx11::string::string(local_b8,(string *)(local_59 + 1));
  TrodesMsg::TrodesMsg(in_RDI,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::c_str();
  receiveMailbox(this_00,sender_00,(char *)in_RDI,local_20,local_18);
  TrodesMsg::~TrodesMsg(local_18);
  std::__cxx11::string::~string((string *)(local_59 + 1));
  return 0;
}

Assistant:

int MlmWrap::route_mailbox_msgs(const char *address, const char *sender, const char *subject, const char *tracker, zmsg_t *msg){
    char *f = zmsg_popstr(msg);
    std::string format = f;
    freen(f);

    TrodesMsg m(format, msg);
    receiveMailbox(sender, subject, format.c_str(), m);
    return 0;
}